

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

void __thiscall
stream::slice_reader::slice_reader
          (slice_reader *this,path_type *dirname,string *basename,string *basename2,
          size_t disk_slice_count)

{
  this->data_offset = 0;
  std::__cxx11::string::string((string *)&this->dir,(string *)dirname);
  std::__cxx11::string::string((string *)&this->base_file,(string *)basename);
  std::__cxx11::string::string((string *)&this->base_file2,(string *)basename2);
  this->slices_per_disk = disk_slice_count;
  this->current_slice = 0;
  this->slice_size = 0;
  boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream(&this->ifs);
  this->is = (istream *)&this->ifs;
  return;
}

Assistant:

slice_reader::slice_reader(const path_type & dirname, const std::string & basename,
                           const std::string & basename2, size_t disk_slice_count)
	: data_offset(0),
	  dir(dirname), base_file(basename), base_file2(basename2),
	  slices_per_disk(disk_slice_count), current_slice(0), slice_size(0),
	  is(&ifs) { }